

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

uchar checkStringVectorOutParameter(char ***paths,uint **lengths,uint *count)

{
  if (((lengths == (uint **)0x0) || (paths == (char ***)0x0)) || (count == (uint *)0x0)) {
    if (paths != (char ***)0x0) {
      *paths = (char **)0x0;
    }
    if (lengths != (uint **)0x0) {
      *lengths = (uint *)0x0;
    }
    if (count != (uint *)0x0) {
      *count = 0;
    }
  }
  return paths != (char ***)0x0;
}

Assistant:

unsigned char checkStringVectorOutParameter(char *** paths, unsigned int ** lengths, unsigned int * count)
{
    if (paths == 0x0 || count == 0x0 || lengths == 0x0)
    {
        if (paths != 0x0)
        {
            *paths = 0x0;
        }

        if (lengths != 0x0)
        {
            *lengths = 0x0;
        }

        if (count != 0x0)
        {
            *count = 0;
        }
    }

    return paths != 0x0;
}